

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_help.cpp
# Opt level: O0

void __thiscall Help_BuildTwoCategories_Test::TestBody(Help_BuildTwoCategories_Test *this)

{
  allocator<pstore::command_line::option_*> *this_00;
  initializer_list<pstore::command_line::option_*> __l;
  bool bVar1;
  char *pcVar2;
  pointer ppVar3;
  _Head_base<0UL,_pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*,_false>
  in_stack_fffffffffffffb40;
  AssertHelper local_440;
  Message local_438;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  *local_430;
  testing local_428 [8];
  char local_420 [8];
  undefined1 local_418 [8];
  AssertionResult gtest_ar_4;
  Message local_400;
  option_category *local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_3;
  Message local_3d8;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  *local_3d0;
  testing local_3c8 [8];
  char local_3c0 [8];
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_2;
  Message local_3a0;
  void *local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_1;
  const_iterator it;
  AssertHelper local_370;
  Message local_368;
  uint local_35c;
  size_type local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar;
  categories_collection actual;
  option *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  iterator local_2f0;
  size_type local_2e8;
  undefined1 local_2e0 [8];
  options_container container;
  undefined1 local_2c0 [8];
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option3;
  string local_1f0;
  undefined1 local_1d0 [8];
  option_category category;
  undefined1 local_1a0 [8];
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option2;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  option1;
  Help_BuildTwoCategories_Test *this_local;
  
  pstore::command_line::
  opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>::
  opt<char[5],pstore::command_line::details::positional>
            ((opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> *)
             ((long)&option2.parser_.super_parser_base.literals_.
                     super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                     ._M_impl.super__Vector_impl_data + 0x10),(char (*) [5])"arg1",
             (positional *)&pstore::command_line::positional);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::opt<char[5]>((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                  *)local_1a0,(char (*) [5])"arg2");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1f0,"category",
             (allocator *)
             ((long)&option3.parser_.super_parser_base.literals_.
                     super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                     ._M_impl.super__Vector_impl_data + 0x17));
  pstore::command_line::option_category::option_category((option_category *)local_1d0,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&option3.parser_.super_parser_base.literals_.
                     super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                     ._M_impl.super__Vector_impl_data + 0x17));
  container.
  super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>.
  _M_impl._M_node._M_size = (size_t)pstore::command_line::cat((option_category *)local_1d0);
  pstore::command_line::
  opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>::
  opt<char[5],pstore::command_line::details::category>
            ((opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>> *)
             local_2c0,(char (*) [5])"arg3",
             (category *)
             &container.
              super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
              ._M_impl._M_node._M_size);
  local_308 = (option *)
              ((long)&option2.parser_.super_parser_base.literals_.
                      super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                      ._M_impl.super__Vector_impl_data + 0x10);
  local_300 = local_1a0;
  local_2f8 = local_2c0;
  local_2f0 = &local_308;
  local_2e8 = 3;
  this_00 = (allocator<pstore::command_line::option_*> *)
            ((long)&actual._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
  std::allocator<pstore::command_line::option_*>::allocator(this_00);
  __l._M_len = local_2e8;
  __l._M_array = local_2f0;
  std::__cxx11::
  list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::list
            ((list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
              *)local_2e0,__l,this_00);
  std::allocator<pstore::command_line::option_*>::~allocator
            ((allocator<pstore::command_line::option_*> *)
             ((long)&actual._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  pstore::command_line::details::build_categories
            ((categories_collection *)&gtest_ar.message_,(option *)0x0,
             (options_container *)local_2e0);
  local_358 = std::
              map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
              ::size((map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
                      *)&gtest_ar.message_);
  local_35c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_350,"actual.size ()","2U",&local_358,&local_35c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
               ,0x5f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  if (bVar1) {
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::
           begin<std::map<pstore::command_line::option_category_const*,std::set<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>,std::less<pstore::command_line::option_category_const*>,std::allocator<std::pair<pstore::command_line::option_category_const*const,std::set<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>>>>>
                     ((map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
                       *)&gtest_ar.message_);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
                           *)&gtest_ar_1.message_);
    local_398 = (void *)0x0;
    testing::internal::EqHelper::
    Compare<const_pstore::command_line::option_category_*,_std::nullptr_t,_nullptr>
              ((EqHelper *)local_390,"it->first","nullptr",&ppVar3->first,&local_398);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
    if (!bVar1) {
      testing::Message::Message(&local_3a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
                 ,0x61,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_3a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
    local_3d0 = (opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                 *)local_1a0;
    testing::
    ElementsAre<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>
              (local_3c8,&local_3d0);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>>>
              ((ElementsAreMatcher<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>_>
                )in_stack_fffffffffffffb40._M_head_impl);
    std::
    _Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
                  *)&gtest_ar_1.message_);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>>>
    ::operator()(local_3b8,local_3c0,
                 (set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>
                  *)"it->second");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
    if (!bVar1) {
      testing::Message::Message(&local_3d8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
                 ,0x62,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_3d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
    std::
    _Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
                  *)&gtest_ar_1.message_);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
                           *)&gtest_ar_1.message_);
    local_3f8 = (option_category *)local_1d0;
    testing::internal::EqHelper::
    Compare<const_pstore::command_line::option_category_*,_pstore::command_line::option_category_*,_nullptr>
              ((EqHelper *)local_3f0,"it->first","&category",&ppVar3->first,&local_3f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
    if (!bVar1) {
      testing::Message::Message(&local_400);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
                 ,100,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_400);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_400);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
    local_430 = (opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                 *)local_2c0;
    testing::
    ElementsAre<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>
              (local_428,&local_430);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>>>
              ((ElementsAreMatcher<std::tuple<pstore::command_line::opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_*>_>
                )in_stack_fffffffffffffb40._M_head_impl);
    std::
    _Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>
                  *)&gtest_ar_1.message_);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<pstore::command_line::opt<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>*>>>
    ::operator()(local_418,local_420,
                 (set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>
                  *)"it->second");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
    if (!bVar1) {
      testing::Message::Message(&local_438);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
      testing::internal::AssertHelper::AssertHelper
                (&local_440,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_help.cpp"
                 ,0x65,pcVar2);
      testing::internal::AssertHelper::operator=(&local_440,&local_438);
      testing::internal::AssertHelper::~AssertHelper(&local_440);
      testing::Message::~Message(&local_438);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  }
  std::
  map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
  ::~map((map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
          *)&gtest_ar.message_);
  std::__cxx11::
  list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::~list
            ((list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
              *)local_2e0);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
          *)local_2c0);
  pstore::command_line::option_category::~option_category((option_category *)local_1d0);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
          *)local_1a0);
  pstore::command_line::
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  ::~opt((opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
          *)((long)&option2.parser_.super_parser_base.literals_.
                    super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                    ._M_impl.super__Vector_impl_data + 0x10));
  return;
}

Assistant:

TEST_F (Help, BuildTwoCategories) {
    opt<std::string> option1{"arg1", positional};
    opt<std::string> option2{"arg2"};
    option_category category{"category"};
    opt<std::string> option3{"arg3", cat (category)};

    option::options_container container{&option1, &option2, &option3};
    details::categories_collection const actual = details::build_categories (nullptr, container);

    ASSERT_EQ (actual.size (), 2U);
    auto it = std::begin (actual);
    EXPECT_EQ (it->first, nullptr);
    EXPECT_THAT (it->second, testing::ElementsAre (&option2));
    ++it;
    EXPECT_EQ (it->first, &category);
    EXPECT_THAT (it->second, testing::ElementsAre (&option3));
}